

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall duckdb::ZSTDCompressionState::ResetOutBuffer(ZSTDCompressionState *this)

{
  page_offset_t pVar1;
  idx_t iVar2;
  
  (this->out_buffer).dst = this->current_buffer_ptr;
  (this->out_buffer).pos = 0;
  iVar2 = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  pVar1 = GetCurrentOffset(this);
  (this->out_buffer).size = (iVar2 - pVar1) - 8;
  return;
}

Assistant:

void ResetOutBuffer() {
		out_buffer.dst = current_buffer_ptr;
		out_buffer.pos = 0;

		auto remaining_space = info.GetBlockSize() - GetCurrentOffset() - sizeof(block_id_t);
		out_buffer.size = remaining_space;
	}